

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O0

void RGBAToUVRow_SSSE3(uint8_t *src_rgba0,int src_stride_rgba,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  uint8_t *puVar1;
  bool bVar2;
  vec8 aiVar3;
  vec8 aiVar4;
  uint8_t *puVar5;
  int iVar6;
  long lVar7;
  undefined1 uVar8;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 uVar26;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  undefined1 uVar38;
  undefined1 uVar39;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 auVar27 [16];
  undefined1 uVar43;
  undefined1 uVar45;
  undefined1 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 uVar56;
  undefined1 uVar57;
  undefined1 uVar58;
  undefined1 uVar59;
  undefined1 auVar44 [16];
  undefined1 uVar60;
  undefined1 uVar62;
  undefined1 uVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  undefined1 uVar66;
  undefined1 uVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  undefined1 uVar70;
  undefined1 uVar71;
  undefined1 uVar72;
  undefined1 uVar73;
  undefined1 uVar74;
  undefined1 uVar75;
  undefined1 uVar76;
  undefined1 auVar61 [16];
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  int src_stride_rgba_local;
  uint8_t *src_rgba0_local;
  
  aiVar4 = libyuv::kRGBAToU;
  aiVar3 = libyuv::kRGBAToV;
  lVar7 = (long)src_stride_rgba;
  puVar5 = dst_u;
  do {
    puVar1 = src_rgba0 + lVar7;
    uVar8 = pavgb(*src_rgba0,*puVar1);
    uVar11 = pavgb(src_rgba0[1],puVar1[1]);
    uVar12 = pavgb(src_rgba0[2],puVar1[2]);
    uVar13 = pavgb(src_rgba0[3],puVar1[3]);
    uVar14 = pavgb(src_rgba0[4],puVar1[4]);
    uVar15 = pavgb(src_rgba0[5],puVar1[5]);
    uVar16 = pavgb(src_rgba0[6],puVar1[6]);
    uVar17 = pavgb(src_rgba0[7],puVar1[7]);
    uVar18 = pavgb(src_rgba0[8],puVar1[8]);
    uVar19 = pavgb(src_rgba0[9],puVar1[9]);
    uVar20 = pavgb(src_rgba0[10],puVar1[10]);
    uVar21 = pavgb(src_rgba0[0xb],puVar1[0xb]);
    uVar22 = pavgb(src_rgba0[0xc],puVar1[0xc]);
    uVar23 = pavgb(src_rgba0[0xd],puVar1[0xd]);
    uVar24 = pavgb(src_rgba0[0xe],puVar1[0xe]);
    uVar25 = pavgb(src_rgba0[0xf],puVar1[0xf]);
    puVar1 = src_rgba0 + lVar7 + 0x10;
    uVar26 = pavgb(src_rgba0[0x10],*puVar1);
    uVar28 = pavgb(src_rgba0[0x11],puVar1[1]);
    uVar29 = pavgb(src_rgba0[0x12],puVar1[2]);
    uVar30 = pavgb(src_rgba0[0x13],puVar1[3]);
    uVar31 = pavgb(src_rgba0[0x14],puVar1[4]);
    uVar32 = pavgb(src_rgba0[0x15],puVar1[5]);
    uVar33 = pavgb(src_rgba0[0x16],puVar1[6]);
    uVar34 = pavgb(src_rgba0[0x17],puVar1[7]);
    uVar35 = pavgb(src_rgba0[0x18],puVar1[8]);
    uVar36 = pavgb(src_rgba0[0x19],puVar1[9]);
    uVar37 = pavgb(src_rgba0[0x1a],puVar1[10]);
    uVar38 = pavgb(src_rgba0[0x1b],puVar1[0xb]);
    uVar39 = pavgb(src_rgba0[0x1c],puVar1[0xc]);
    uVar40 = pavgb(src_rgba0[0x1d],puVar1[0xd]);
    uVar41 = pavgb(src_rgba0[0x1e],puVar1[0xe]);
    uVar42 = pavgb(src_rgba0[0x1f],puVar1[0xf]);
    puVar1 = src_rgba0 + lVar7 + 0x20;
    uVar43 = pavgb(src_rgba0[0x20],*puVar1);
    uVar45 = pavgb(src_rgba0[0x21],puVar1[1]);
    uVar46 = pavgb(src_rgba0[0x22],puVar1[2]);
    uVar47 = pavgb(src_rgba0[0x23],puVar1[3]);
    uVar48 = pavgb(src_rgba0[0x24],puVar1[4]);
    uVar49 = pavgb(src_rgba0[0x25],puVar1[5]);
    uVar50 = pavgb(src_rgba0[0x26],puVar1[6]);
    uVar51 = pavgb(src_rgba0[0x27],puVar1[7]);
    uVar52 = pavgb(src_rgba0[0x28],puVar1[8]);
    uVar53 = pavgb(src_rgba0[0x29],puVar1[9]);
    uVar54 = pavgb(src_rgba0[0x2a],puVar1[10]);
    uVar55 = pavgb(src_rgba0[0x2b],puVar1[0xb]);
    uVar56 = pavgb(src_rgba0[0x2c],puVar1[0xc]);
    uVar57 = pavgb(src_rgba0[0x2d],puVar1[0xd]);
    uVar58 = pavgb(src_rgba0[0x2e],puVar1[0xe]);
    uVar59 = pavgb(src_rgba0[0x2f],puVar1[0xf]);
    puVar1 = src_rgba0 + lVar7 + 0x30;
    uVar60 = pavgb(src_rgba0[0x30],*puVar1);
    uVar62 = pavgb(src_rgba0[0x31],puVar1[1]);
    uVar63 = pavgb(src_rgba0[0x32],puVar1[2]);
    uVar64 = pavgb(src_rgba0[0x33],puVar1[3]);
    uVar65 = pavgb(src_rgba0[0x34],puVar1[4]);
    uVar66 = pavgb(src_rgba0[0x35],puVar1[5]);
    uVar67 = pavgb(src_rgba0[0x36],puVar1[6]);
    uVar68 = pavgb(src_rgba0[0x37],puVar1[7]);
    uVar69 = pavgb(src_rgba0[0x38],puVar1[8]);
    uVar70 = pavgb(src_rgba0[0x39],puVar1[9]);
    uVar71 = pavgb(src_rgba0[0x3a],puVar1[10]);
    uVar72 = pavgb(src_rgba0[0x3b],puVar1[0xb]);
    uVar73 = pavgb(src_rgba0[0x3c],puVar1[0xc]);
    uVar74 = pavgb(src_rgba0[0x3d],puVar1[0xd]);
    uVar75 = pavgb(src_rgba0[0x3e],puVar1[0xe]);
    uVar76 = pavgb(src_rgba0[0x3f],puVar1[0xf]);
    src_rgba0 = src_rgba0 + 0x40;
    auVar10[0] = pavgb(uVar8,uVar14);
    auVar10[1] = pavgb(uVar11,uVar15);
    auVar10[2] = pavgb(uVar12,uVar16);
    auVar10[3] = pavgb(uVar13,uVar17);
    auVar10[4] = pavgb(uVar18,uVar22);
    auVar10[5] = pavgb(uVar19,uVar23);
    auVar10[6] = pavgb(uVar20,uVar24);
    auVar10[7] = pavgb(uVar21,uVar25);
    auVar10[8] = pavgb(uVar26,uVar31);
    auVar10[9] = pavgb(uVar28,uVar32);
    auVar10[10] = pavgb(uVar29,uVar33);
    auVar10[0xb] = pavgb(uVar30,uVar34);
    auVar10[0xc] = pavgb(uVar35,uVar39);
    auVar10[0xd] = pavgb(uVar36,uVar40);
    auVar10[0xe] = pavgb(uVar37,uVar41);
    auVar10[0xf] = pavgb(uVar38,uVar42);
    auVar61[0] = pavgb(uVar43,uVar48);
    auVar61[1] = pavgb(uVar45,uVar49);
    auVar61[2] = pavgb(uVar46,uVar50);
    auVar61[3] = pavgb(uVar47,uVar51);
    auVar61[4] = pavgb(uVar52,uVar56);
    auVar61[5] = pavgb(uVar53,uVar57);
    auVar61[6] = pavgb(uVar54,uVar58);
    auVar61[7] = pavgb(uVar55,uVar59);
    auVar61[8] = pavgb(uVar60,uVar65);
    auVar61[9] = pavgb(uVar62,uVar66);
    auVar61[10] = pavgb(uVar63,uVar67);
    auVar61[0xb] = pavgb(uVar64,uVar68);
    auVar61[0xc] = pavgb(uVar69,uVar73);
    auVar61[0xd] = pavgb(uVar70,uVar74);
    auVar61[0xe] = pavgb(uVar71,uVar75);
    auVar61[0xf] = pavgb(uVar72,uVar76);
    auVar9 = pmaddubsw(auVar10,(undefined1  [16])aiVar4);
    auVar44 = pmaddubsw(auVar61,(undefined1  [16])aiVar4);
    auVar27 = pmaddubsw(auVar10,(undefined1  [16])aiVar3);
    auVar61 = pmaddubsw(auVar61,(undefined1  [16])aiVar3);
    auVar10 = phaddw(auVar9,auVar44);
    auVar9 = phaddw(auVar27,auVar61);
    auVar10 = psraw(auVar10,8);
    auVar9 = psraw(auVar9,8);
    auVar10 = packsswb(auVar10,auVar9);
    *puVar5 = auVar10[0] + 0x80;
    puVar5[1] = auVar10[1] + 0x80;
    puVar5[2] = auVar10[2] + 0x80;
    puVar5[3] = auVar10[3] + 0x80;
    puVar5[4] = auVar10[4] + 0x80;
    puVar5[5] = auVar10[5] + 0x80;
    puVar5[6] = auVar10[6] + 0x80;
    puVar5[7] = auVar10[7] + 0x80;
    puVar5[(long)(dst_v + (8 - (long)dst_u))] = auVar10[8] + 0x80;
    puVar5[(long)(dst_v + (9 - (long)dst_u))] = auVar10[9] + 0x80;
    puVar5[(long)(dst_v + (10 - (long)dst_u))] = auVar10[10] + 0x80;
    puVar5[(long)(dst_v + (0xb - (long)dst_u))] = auVar10[0xb] + 0x80;
    puVar5[(long)(dst_v + (0xc - (long)dst_u))] = auVar10[0xc] + 0x80;
    puVar5[(long)(dst_v + (0xd - (long)dst_u))] = auVar10[0xd] + 0x80;
    puVar5[(long)(dst_v + (0xe - (long)dst_u))] = auVar10[0xe] + 0x80;
    puVar5[(long)(dst_v + (0xf - (long)dst_u))] = auVar10[0xf] + 0x80;
    puVar5 = puVar5 + 8;
    iVar6 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar6;
  } while (iVar6 != 0 && bVar2);
  return;
}

Assistant:

void RGBAToUVRow_SSSE3(const uint8_t* src_rgba0,
                       int src_stride_rgba,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  asm volatile(
      "movdqa      %5,%%xmm3                     \n"
      "movdqa      %6,%%xmm4                     \n"
      "movdqa      %7,%%xmm5                     \n"
      "sub         %1,%2                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%4,1),%%xmm7          \n"
      "pavgb       %%xmm7,%%xmm0                 \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "movdqu      0x10(%0,%4,1),%%xmm7          \n"
      "pavgb       %%xmm7,%%xmm1                 \n"
      "movdqu      0x20(%0),%%xmm2               \n"
      "movdqu      0x20(%0,%4,1),%%xmm7          \n"
      "pavgb       %%xmm7,%%xmm2                 \n"
      "movdqu      0x30(%0),%%xmm6               \n"
      "movdqu      0x30(%0,%4,1),%%xmm7          \n"
      "pavgb       %%xmm7,%%xmm6                 \n"

      "lea         0x40(%0),%0                   \n"
      "movdqa      %%xmm0,%%xmm7                 \n"
      "shufps      $0x88,%%xmm1,%%xmm0           \n"
      "shufps      $0xdd,%%xmm1,%%xmm7           \n"
      "pavgb       %%xmm7,%%xmm0                 \n"
      "movdqa      %%xmm2,%%xmm7                 \n"
      "shufps      $0x88,%%xmm6,%%xmm2           \n"
      "shufps      $0xdd,%%xmm6,%%xmm7           \n"
      "pavgb       %%xmm7,%%xmm2                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm2,%%xmm6                 \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm3,%%xmm1                 \n"
      "pmaddubsw   %%xmm3,%%xmm6                 \n"
      "phaddw      %%xmm2,%%xmm0                 \n"
      "phaddw      %%xmm6,%%xmm1                 \n"
      "psraw       $0x8,%%xmm0                   \n"
      "psraw       $0x8,%%xmm1                   \n"
      "packsswb    %%xmm1,%%xmm0                 \n"
      "paddb       %%xmm5,%%xmm0                 \n"
      "movlps      %%xmm0,(%1)                   \n"
      "movhps      %%xmm0,0x00(%1,%2,1)          \n"
      "lea         0x8(%1),%1                    \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_rgba0),                   // %0
        "+r"(dst_u),                       // %1
        "+r"(dst_v),                       // %2
        "+rm"(width)                       // %3
      : "r"((intptr_t)(src_stride_rgba)),  // %4
        "m"(kRGBAToV),                     // %5
        "m"(kRGBAToU),                     // %6
        "m"(kAddUV128)                     // %7
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm6", "xmm7");
}